

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int form_driver(FORM *form,int c)

{
  uint uVar1;
  uint uVar2;
  _func_int_FORM_ptr *p_Var3;
  _Bool _Var4;
  int iVar5;
  FIELD *pFVar6;
  int *piVar7;
  ushort **ppuVar8;
  
  if (form == (FORM *)0x0) {
    piVar7 = __errno_location();
    *piVar7 = -2;
    iVar5 = -2;
  }
  else if (form->field == (FIELD **)0x0) {
    piVar7 = __errno_location();
    *piVar7 = -0xb;
    iVar5 = -0xb;
  }
  else {
    if (form->page == (_PAGE *)0x0) {
      __assert_fail("form->page != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                    ,0xe6a,"int form_driver(FORM *, int)");
    }
    if (c == -0x470f0) {
      pFVar6 = _nc_First_Active_Field(form);
      form->current = pFVar6;
      iVar5 = 0;
    }
    else {
      pFVar6 = form->current;
      if (((pFVar6 == (FIELD *)0x0) || (pFVar6->buf == (char *)0x0)) || (pFVar6->form != form)) {
        __assert_fail("form->current && form->current->buf && (form->current->form == form)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                      ,0xe75,"int form_driver(FORM *, int)");
      }
      if ((form->status & 2) == 0) {
        if ((form->status & 1) == 0) {
          piVar7 = __errno_location();
          *piVar7 = -7;
          iVar5 = -7;
        }
        else {
          uVar1 = c - 0x200;
          if (uVar1 < 0x39) {
            uVar2 = bindings[uVar1].keycode;
            iVar5 = -8;
            if ((((uVar2 & 0xffff) == c) && (iVar5 = -1, uVar2 < 0x90000)) &&
               (p_Var3 = bindings[uVar1].cmd, p_Var3 != (_func_int_FORM_ptr *)0x0)) {
              if ((0x1c4UL >> ((ulong)(uVar2 >> 0x10) & 0x3f) & 1) == 0) {
                iVar5 = (*form_driver::Generic_Methods[uVar2 >> 0x10])(p_Var3,form);
              }
              else {
                iVar5 = (*p_Var3)(form);
              }
            }
          }
          else {
            iVar5 = -8;
            if ((((uint)c < 0x100) &&
                (ppuVar8 = __ctype_b_loc(),
                (*(byte *)((long)*ppuVar8 + (ulong)(uint)c * 2 + 1) & 0x40) != 0)) &&
               (_Var4 = Check_Char(pFVar6->type,c,(TypeArgument *)pFVar6->arg), _Var4)) {
              iVar5 = Data_Entry(form,c);
            }
          }
          _nc_Refresh_Current_Field(form);
          piVar7 = __errno_location();
          *piVar7 = iVar5;
        }
      }
      else {
        piVar7 = __errno_location();
        *piVar7 = -5;
        iVar5 = -5;
      }
    }
  }
  return iVar5;
}

Assistant:

int form_driver(FORM * form, int  c)
{
  const Binding_Info* BI = (Binding_Info *)0;
  int res = E_UNKNOWN_COMMAND;

  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (!(form->field))
    RETURN(E_NOT_CONNECTED);
  
  assert(form->page != 0);
  
  if (c==FIRST_ACTIVE_MAGIC)
    {
      form->current = _nc_First_Active_Field(form);
      return E_OK;
    }
  
  assert(form->current && 
         form->current->buf && 
         (form->current->form == form)
        );
  
  if ( form->status & _IN_DRIVER )
    RETURN(E_BAD_STATE);

  if ( !( form->status & _POSTED ) ) 
    RETURN(E_NOT_POSTED);
  
  if ((c>=MIN_FORM_COMMAND && c<=MAX_FORM_COMMAND) &&
      ((bindings[c-MIN_FORM_COMMAND].keycode & Key_Mask) == c))
    BI = &(bindings[c-MIN_FORM_COMMAND]);
  
  if (BI)
    {
      typedef int (*Generic_Method)(int (* const)(FORM *),FORM *);
      static const Generic_Method Generic_Methods[] = 
        {
          Page_Navigation,         /* overloaded to call field&form hooks */
          Inter_Field_Navigation,  /* overloaded to call field hooks      */
          NULL,                    /* Intra-Field is generic              */
          Vertical_Scrolling,      /* Overloaded to check multi-line      */
          Horizontal_Scrolling,    /* Overloaded to check single-line     */
          Field_Editing,           /* Overloaded to mark modification     */
          NULL,                    /* Edit Mode is generic                */
          NULL,                    /* Field Validation is generic         */
          NULL                     /* Choice Request is generic           */
        };
      size_t nMethods = (sizeof(Generic_Methods)/sizeof(Generic_Methods[0]));
      size_t method   = ((BI->keycode & ID_Mask) >> ID_Shft) & 0xffff;
      
      if ( (method >= nMethods) || !(BI->cmd) )
        res = E_SYSTEM_ERROR;
      else
        {
          Generic_Method fct = Generic_Methods[method];
          if (fct)
            res = fct(BI->cmd,form);
          else
            res = (BI->cmd)(form);
        }
    } 
  else 
    {
      if (!(c & (~(int)MAX_REGULAR_CHARACTER)) &&
          isprint((unsigned char)c) &&                      
          Check_Char(form->current->type,c,
                     (TypeArgument *)(form->current->arg)))
        res = Data_Entry(form,c);
    }
  _nc_Refresh_Current_Field(form);
  RETURN(res);
}